

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_io.c
# Opt level: O3

int ARKStepSetImplicit(void *arkode_mem)

{
  int iVar1;
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  ARKodeMem local_18;
  ARKodeARKStepMem local_10;
  
  iVar1 = arkStep_AccessStepMem(arkode_mem,"ARKStepSetImplicit",&local_18,&local_10);
  if (iVar1 == 0) {
    if (local_10->fi == (ARKRhsFn)0x0) {
      iVar1 = -0x16;
      arkProcessError(local_18,-0x16,"ARKode::ARKStep","ARKStepSetImplicit",
                      "Cannot specify that method is implicit without providing a function pointer to fi(t,y)."
                     );
    }
    else {
      local_10->explicit = 0;
      local_10->implicit = 1;
      if (local_18->user_efun == 0) {
        if ((local_18->itol == 1) && (local_18->Vabstol != (N_Vector)0x0)) {
          iVar1 = arkSVtolerances(local_18,local_18->reltol,local_18->Vabstol);
        }
        else {
          iVar1 = arkSStolerances(local_18,local_18->reltol,local_18->Sabstol);
        }
        if (iVar1 != 0) {
          return iVar1;
        }
      }
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int ARKStepSetImplicit(void *arkode_mem)
{
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  int retval;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(arkode_mem, "ARKStepSetImplicit",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* ensure that fi is defined */
  if (step_mem->fi == NULL) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep",
                    "ARKStepSetImplicit", MSG_ARK_MISSING_FI);
    return(ARK_ILL_INPUT);
  }

  /* set the relevant parameters */
  step_mem->implicit = SUNTRUE;
  step_mem->explicit = SUNFALSE;

  /* re-attach internal error weight functions if necessary */
  if (!ark_mem->user_efun) {
    if (ark_mem->itol == ARK_SV && ark_mem->Vabstol != NULL)
      retval = arkSVtolerances(ark_mem, ark_mem->reltol, ark_mem->Vabstol);
    else
      retval = arkSStolerances(ark_mem, ark_mem->reltol, ark_mem->Sabstol);
    if (retval != ARK_SUCCESS) return(retval);
  }

  return(ARK_SUCCESS);
}